

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O3

void skiwi::compile_string_set(asmcode *code,compiler_options *ops)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  skiwi *psVar2;
  uint64_t in_RDX;
  uint64_t lab;
  uint64_t lab_00;
  string in_bounds;
  string not_in_bounds;
  string error;
  operand local_9c;
  operand local_98 [3];
  operand local_8c;
  string local_88;
  operand local_64;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  psVar2 = label;
  paVar1 = &local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_88,psVar2,in_RDX);
    std::__cxx11::string::operator=((string *)&local_40,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    local_88._M_dataplus._M_p._0_4_ = 5;
    local_60._M_dataplus._M_p._0_4_ = 0x14;
    local_98[0] = 0x39;
    local_9c = BL;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_88,(operand *)&local_60,local_98,(int *)&local_9c);
    local_88._M_dataplus._M_p._0_4_ = 0x34;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_88,&local_40);
    jump_if_arg_is_not_block(code,RCX,R11,&local_40);
  }
  local_60._M_dataplus._M_p._0_4_ = 2;
  local_98[0] = RCX;
  local_9c = NUMBER;
  local_88._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,(operation *)&local_60,local_98,&local_9c,(unsigned_long *)&local_88);
  if (ops->safe_primitives == true) {
    jump_short_if_arg_does_not_point_to_string(code,RCX,R11,&local_40);
    local_88._M_dataplus._M_p._0_4_ = 0x5a;
    local_60._M_dataplus._M_p._0_4_ = 0xc;
    local_98[0] = NUMBER;
    local_9c = AL;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_88,(operand *)&local_60,local_98,(int *)&local_9c);
    local_88._M_dataplus._M_p._0_4_ = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_88,&local_40);
    local_88._M_dataplus._M_p._0_4_ = 0x40;
    local_60._M_dataplus._M_p._0_4_ = 0x14;
    local_98[0] = RSI;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,(operation *)&local_88,(operand *)&local_60,local_98);
    local_88._M_dataplus._M_p._0_4_ = 2;
    local_60._M_dataplus._M_p._0_4_ = 0x14;
    local_98[0] = NUMBER;
    local_9c = 0xff;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_88,(operand *)&local_60,local_98,(int *)&local_9c);
    local_88._M_dataplus._M_p._0_4_ = 5;
    local_60._M_dataplus._M_p._0_4_ = 0x14;
    local_98[0] = NUMBER;
    local_9c = R14;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_88,(operand *)&local_60,local_98,(int *)&local_9c);
    local_88._M_dataplus._M_p._0_4_ = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_88,&local_40);
  }
  local_88._M_dataplus._M_p._0_4_ = 0x4e;
  local_60._M_dataplus._M_p._0_4_ = 0xc;
  local_98[0] = NUMBER;
  local_9c = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_88,(operand *)&local_60,local_98,(int *)&local_9c);
  psVar2 = label;
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_88,psVar2,lab);
    psVar2 = label;
    label = label + 1;
    label_to_string_abi_cxx11_(&local_60,psVar2,lab_00);
    local_98[0] = 0x40;
    local_9c = RAX;
    local_8c = MEM_RCX;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,local_98,&local_9c,&local_8c);
    local_9c = ST6;
    local_8c = R15;
    local_64 = NUMBER;
    local_98[0] = ~EMPTY;
    local_98[1] = 0xffffff;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,long>
              (code,&local_9c,&local_8c,&local_64,(long *)local_98);
    local_98[0] = AH;
    local_9c = RAX;
    local_8c = R15;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,local_98,&local_9c,&local_8c);
    local_98[0] = XMM13|CL;
    local_9c = RAX;
    local_8c = NUMBER;
    local_64 = BL;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_98,&local_9c,&local_8c,(int *)&local_64);
    local_98[0] = CL;
    local_9c = RDX;
    local_8c = RAX;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,local_98,&local_9c,&local_8c);
    local_98[0] = ST2;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_98,&local_60);
    local_98[0] = CL;
    local_9c = RDX;
    local_8c = NUMBER;
    local_64 = EMPTY;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_98,&local_9c,&local_8c,(int *)&local_64);
    local_98[0] = ST2;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_98,&local_88);
    error_label(code,&local_60,re_string_set_out_of_bounds);
    local_98[0] = ST4;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_98,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_60._M_dataplus._M_p._4_4_,local_60._M_dataplus._M_p._0_4_) !=
        &local_60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_60._M_dataplus._M_p._4_4_,local_60._M_dataplus._M_p._0_4_),
                      local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  local_88._M_dataplus._M_p = local_88._M_dataplus._M_p & 0xffffffff00000000;
  local_60._M_dataplus._M_p._0_4_ = 0xc;
  local_98[0] = NUMBER;
  local_9c = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_88,(operand *)&local_60,local_98,(int *)&local_9c);
  local_88._M_dataplus._M_p = local_88._M_dataplus._M_p & 0xffffffff00000000;
  local_60._M_dataplus._M_p._0_4_ = 0xb;
  local_98[0] = RDX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_88,(operand *)&local_60,local_98);
  local_88._M_dataplus._M_p._0_4_ = 0x40;
  local_60._M_dataplus._M_p._0_4_ = 9;
  local_98[0] = RSI;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_88,(operand *)&local_60,local_98);
  local_88._M_dataplus._M_p._0_4_ = 0x56;
  local_60._M_dataplus._M_p._0_4_ = 9;
  local_98[0] = NUMBER;
  local_9c = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_88,(operand *)&local_60,local_98,(int *)&local_9c);
  local_88._M_dataplus._M_p._0_4_ = 0x40;
  local_60._M_dataplus._M_p._0_4_ = 0x2b;
  local_98[0] = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_88,(operand *)&local_60,local_98);
  local_88._M_dataplus._M_p._0_4_ = 0x40;
  local_60._M_dataplus._M_p._0_4_ = 9;
  local_98[0] = 0xd;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_88,(operand *)&local_60,local_98);
  local_88._M_dataplus._M_p._0_4_ = 0x2c;
  local_60._M_dataplus._M_p._0_4_ = 10;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_88,(operand *)&local_60);
  if (ops->safe_primitives == true) {
    error_label(code,&local_40,re_string_set_contract_violation);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void compile_string_set(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 3);
    code.add(asmcode::JNE, error);
    jump_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error); // assembly can jump short, but vm cannot
    }
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  // here check whether it is a string and a char
  if (ops.safe_primitives)
    {
    jump_short_if_arg_does_not_point_to_string(code, asmcode::RCX, asmcode::R11, error);
    code.add(asmcode::TEST, asmcode::RDX, asmcode::NUMBER, 1);
    code.add(asmcode::JNES, error);
    code.add(asmcode::MOV, asmcode::R11, asmcode::RSI);
    code.add(asmcode::AND, asmcode::R11, asmcode::NUMBER, char_mask);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, char_tag);
    code.add(asmcode::JNES, error);
    }
  code.add(asmcode::SAR, asmcode::RDX, asmcode::NUMBER, 1);
  if (ops.safe_primitives)
    {
    // optionally, check whether rdx is in bounds.
    std::string in_bounds = label_to_string(label++);
    std::string not_in_bounds = label_to_string(label++);
    code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_RCX);
    code.add(asmcode::MOV, asmcode::R15, asmcode::NUMBER, block_size_mask);
    code.add(asmcode::AND, asmcode::RAX, asmcode::R15);
    code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 3);
    code.add(asmcode::CMP, asmcode::RDX, asmcode::RAX);
    code.add(asmcode::JGES, not_in_bounds);
    code.add(asmcode::CMP, asmcode::RDX, asmcode::NUMBER, 0);
    code.add(asmcode::JGES, in_bounds);
    error_label(code, not_in_bounds, re_string_set_out_of_bounds);
    code.add(asmcode::LABEL, in_bounds);
    }

  code.add(asmcode::ADD, asmcode::RDX, asmcode::NUMBER, 8); // increase 8 for header
  code.add(asmcode::ADD, asmcode::RCX, asmcode::RDX);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::RSI);
  code.add(asmcode::SHR, asmcode::RAX, asmcode::NUMBER, 8);
  code.add(asmcode::MOV, asmcode::BYTE_MEM_RCX, asmcode::AL);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::RSI);
  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_string_set_contract_violation);
    }
  }